

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::AssignFrameSlotsRegister(ByteCodeGenerator *this)

{
  Type pFVar1;
  RegSlot RVar2;
  Type *ppFVar3;
  
  ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar3;
  if (pFVar1->frameSlotsRegister == 0xffffffff) {
    RVar2 = NextVarRegister(this);
    pFVar1->frameSlotsRegister = RVar2;
  }
  return;
}

Assistant:

void ByteCodeGenerator::AssignFrameSlotsRegister()
{
    FuncInfo* top = funcInfoStack->Top();
    if (top->frameSlotsRegister == Js::Constants::NoRegister)
    {
        top->frameSlotsRegister = NextVarRegister();
    }
}